

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cpp
# Opt level: O0

bool peparse::readQword(bounded_buffer *b,uint32_t offset,uint64_t *out)

{
  uint64_t uVar1;
  uint64_t *tmp;
  uint64_t *out_local;
  uint32_t offset_local;
  bounded_buffer *b_local;
  
  if (b == (bounded_buffer *)0x0) {
    b_local._7_1_ = false;
  }
  else if (offset < b->bufLen) {
    if ((b->swapBytes & 1U) == 0) {
      *out = *(uint64_t *)(b->buf + offset);
    }
    else {
      uVar1 = anon_unknown.dwarf_3a6c1::byteSwapUint64(*(uint64_t *)(b->buf + offset));
      *out = uVar1;
    }
    b_local._7_1_ = true;
  }
  else {
    b_local._7_1_ = false;
  }
  return b_local._7_1_;
}

Assistant:

bool readQword(bounded_buffer *b, std::uint32_t offset, std::uint64_t &out) {
  if (b == nullptr) {
    return false;
  }

  if (offset >= b->bufLen) {
    return false;
  }

  std::uint64_t *tmp = reinterpret_cast<std::uint64_t *>(b->buf + offset);
  if (b->swapBytes) {
    out = byteSwapUint64(*tmp);
  } else {
    out = *tmp;
  }

  return true;
}